

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>
                   (appender out,unsigned_long value,uint prefix,format_specs<char> *specs,
                   digit_grouping<char> *grouping)

{
  byte bVar1;
  long lVar2;
  appender aVar3;
  byte *pbVar4;
  uint uVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int num_digits;
  char digits [40];
  int local_70;
  uint local_6c;
  anon_class_32_4_dca7119b local_68;
  char local_48 [40];
  
  lVar2 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  local_70 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar2] -
             (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar2]
                                      * 8));
  local_6c = prefix;
  format_decimal<char,unsigned_long>(local_48,value,local_70);
  pbVar4 = (byte *)(grouping->grouping_)._M_dataplus._M_p;
  pbVar6 = pbVar4 + (grouping->grouping_)._M_string_length;
  uVar5 = local_70 - (uint)(local_6c == 0);
  iVar7 = 0;
  do {
    iVar9 = 0x7fffffff;
    if ((grouping->thousands_sep_)._M_string_length != 0) {
      if (pbVar4 == pbVar6) {
        uVar8 = (uint)(char)pbVar6[-1];
      }
      else {
        bVar1 = *pbVar4;
        if ((byte)(bVar1 + 0x81) < 0x82) goto LAB_0010f999;
        pbVar4 = pbVar4 + 1;
        uVar8 = (uint)bVar1;
      }
      iVar7 = iVar7 + uVar8;
      iVar9 = iVar7;
    }
LAB_0010f999:
    uVar5 = uVar5 + 1;
    if (local_70 <= iVar9) {
      if (-1 < (int)uVar5) {
        local_68.prefix = &local_6c;
        local_68.num_digits = &local_70;
        local_68.grouping = grouping;
        local_68.digits = &local_48;
        aVar3 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>(fmt::v10::appender,unsigned_long,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                          (out,specs,(ulong)uVar5,(ulong)uVar5,&local_68);
        return (appender)aVar3.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
        ;
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/core.h"
                  ,0x178,"negative value");
    }
  } while( true );
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) {
          char sign = static_cast<char>(prefix);
          *it++ = static_cast<Char>(sign);
        }
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}